

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O2

match_result_t * __thiscall
zmq::radix_tree_t::match
          (match_result_t *__return_storage_ptr__,radix_tree_t *this,uchar *key_,size_t key_size_,
          bool is_lookup_)

{
  ulong uVar1;
  uint uVar2;
  uchar uVar3;
  node_t current_;
  ulong uVar4;
  node_t nVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong key_bytes_matched_;
  size_t parent_edge_index_;
  node_t parent_;
  node_t grandparent_;
  ulong uVar10;
  ulong uVar11;
  node_t current_node;
  
  if (key_ == (uchar *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","key_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
           );
    fflush(_stderr);
    zmq_abort("key_");
  }
  nVar5._data = (this->_root)._data;
  sVar8 = 0;
  uVar9 = 0;
  parent_edge_index_ = 0;
  current_._data = nVar5._data;
  parent_._data = nVar5._data;
  uVar10 = 0;
  while( true ) {
    grandparent_._data = parent_._data;
    parent_._data = current_._data;
    sVar6 = sVar8;
    current_._data = nVar5._data;
    uVar4 = (ulong)*(uint *)(current_._data + 4);
    sVar8 = sVar6;
    current_node._data = current_._data;
    if ((uVar4 == 0) && (key_bytes_matched_ = uVar9, *(int *)(current_._data + 8) == 0))
    goto LAB_001cb3c7;
    uVar7 = uVar9;
    for (uVar11 = 0;
        ((uVar1 = uVar9 + uVar11, uVar11 < uVar4 && (uVar1 < key_size_)) &&
        (current_._data[uVar11 + 0xc] == key_[uVar11 + uVar9])); uVar11 = uVar11 + 1) {
      uVar7 = uVar7 + 1;
    }
    uVar10 = uVar4;
    if ((uVar4 == uVar11 && is_lookup_) &&
       (key_bytes_matched_ = key_size_, *(int *)current_._data != 0)) goto LAB_001cb3c7;
    if ((uVar4 != uVar11) || (uVar1 == key_size_)) break;
    uVar2 = *(uint *)(current_._data + 8);
    sVar8 = 0;
    while( true ) {
      if (uVar2 == sVar8) {
        sVar8 = sVar6;
        key_bytes_matched_ = uVar9 + uVar11;
        goto LAB_001cb3c7;
      }
      uVar3 = node_t::first_byte_at(&current_node,sVar8);
      if (uVar3 == key_[uVar11 + uVar9]) break;
      sVar8 = sVar8 + 1;
    }
    nVar5 = node_t::node_at(&current_node,sVar8);
    uVar9 = uVar1;
    key_bytes_matched_ = uVar7;
    parent_edge_index_ = sVar6;
    if (nVar5._data == current_._data) goto LAB_001cb3c7;
  }
  key_bytes_matched_ = uVar9 + uVar11;
  uVar10 = uVar11;
LAB_001cb3c7:
  match_result_t::match_result_t
            (__return_storage_ptr__,key_bytes_matched_,uVar10,sVar8,parent_edge_index_,current_,
             parent_,grandparent_);
  return __return_storage_ptr__;
}

Assistant:

match_result_t zmq::radix_tree_t::match (const unsigned char *key_,
                                         size_t key_size_,
                                         bool is_lookup_ = false) const
{
    zmq_assert (key_);

    // Node we're currently at in the traversal and its predecessors.
    node_t current_node = _root;
    node_t parent_node = current_node;
    node_t grandparent_node = current_node;
    // Index of the next byte to match in the key.
    size_t key_byte_index = 0;
    // Index of the next byte to match in the current node's prefix.
    size_t prefix_byte_index = 0;
    // Index of the edge from parent to current node.
    size_t edge_index = 0;
    // Index of the edge from grandparent to parent.
    size_t parent_edge_index = 0;

    while (current_node.prefix_length () > 0 || current_node.edgecount () > 0) {
        const unsigned char *const prefix = current_node.prefix ();
        const size_t prefix_length = current_node.prefix_length ();

        for (prefix_byte_index = 0;
             prefix_byte_index < prefix_length && key_byte_index < key_size_;
             ++prefix_byte_index, ++key_byte_index) {
            if (prefix[prefix_byte_index] != key_[key_byte_index])
                break;
        }

        // Even if a prefix of the key matches and we're doing a
        // lookup, this means we've found a matching subscription.
        if (is_lookup_ && prefix_byte_index == prefix_length
            && current_node.refcount () > 0) {
            key_byte_index = key_size_;
            break;
        }

        // There was a mismatch or we've matched the whole key, so
        // there's nothing more to do.
        if (prefix_byte_index != prefix_length || key_byte_index == key_size_)
            break;

        // We need to match the rest of the key. Check if there's an
        // outgoing edge from this node.
        node_t next_node = current_node;
        for (size_t i = 0, edgecount = current_node.edgecount (); i < edgecount;
             ++i) {
            if (current_node.first_byte_at (i) == key_[key_byte_index]) {
                parent_edge_index = edge_index;
                edge_index = i;
                next_node = current_node.node_at (i);
                break;
            }
        }

        if (next_node == current_node)
            break; // No outgoing edge.
        grandparent_node = parent_node;
        parent_node = current_node;
        current_node = next_node;
    }

    return match_result_t (key_byte_index, prefix_byte_index, edge_index,
                           parent_edge_index, current_node, parent_node,
                           grandparent_node);
}